

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__YCbCr_to_RGB_simd(stbi_uc *out,stbi_uc *y,stbi_uc *pcb,stbi_uc *pcr,int count,int step)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  __m128i brb;
  __m128i gw;
  __m128i bw;
  __m128i rw;
  __m128i gws;
  __m128i bws;
  __m128i gwt;
  __m128i rws;
  __m128i cr1;
  __m128i cb1;
  __m128i cb0;
  __m128i cr0;
  __m128i yws;
  __m128i cbw;
  __m128i crw;
  __m128i yw;
  __m128i cb_biased;
  __m128i cr_biased;
  __m128i cb_bytes;
  __m128i cr_bytes;
  __m128i y_bytes;
  __m128i xw;
  __m128i y_bias;
  __m128i cb_const1;
  __m128i cb_const0;
  __m128i cr_const1;
  __m128i cr_const0;
  __m128i signflip;
  int i;
  uint local_728;
  uint local_724;
  uint local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  int local_504;
  undefined8 *local_4e0;
  int cb;
  int cr;
  int b;
  int g;
  int r;
  int y_fixed;
  __m128i o1;
  __m128i o0;
  __m128i t1;
  __m128i t0;
  __m128i gxb;
  
  local_504 = 0;
  local_4e0 = in_RDI;
  if (in_R9D == 4) {
    auVar1 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar1 = vpinsrb_avx(auVar1,0x80,2);
    auVar1 = vpinsrb_avx(auVar1,0x80,3);
    auVar1 = vpinsrb_avx(auVar1,0x80,4);
    auVar1 = vpinsrb_avx(auVar1,0x80,5);
    auVar1 = vpinsrb_avx(auVar1,0x80,6);
    auVar1 = vpinsrb_avx(auVar1,0x80,7);
    auVar1 = vpinsrb_avx(auVar1,0x80,8);
    auVar1 = vpinsrb_avx(auVar1,0x80,9);
    auVar1 = vpinsrb_avx(auVar1,0x80,10);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xe);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xf);
    o1[1] = auVar1._0_8_;
    o0[0] = auVar1._8_8_;
    auVar1 = vpinsrw_avx(ZEXT216(0x166f),0x166f,1);
    auVar1 = vpinsrw_avx(auVar1,0x166f,2);
    auVar1 = vpinsrw_avx(auVar1,0x166f,3);
    auVar1 = vpinsrw_avx(auVar1,0x166f,4);
    auVar1 = vpinsrw_avx(auVar1,0x166f,5);
    auVar1 = vpinsrw_avx(auVar1,0x166f,6);
    auVar2 = vpinsrw_avx(auVar1,0x166f,7);
    auVar1 = vpinsrw_avx(ZEXT216(0xf493),0xf493,1);
    auVar1 = vpinsrw_avx(auVar1,0xf493,2);
    auVar1 = vpinsrw_avx(auVar1,0xf493,3);
    auVar1 = vpinsrw_avx(auVar1,0xf493,4);
    auVar1 = vpinsrw_avx(auVar1,0xf493,5);
    auVar1 = vpinsrw_avx(auVar1,0xf493,6);
    auVar3 = vpinsrw_avx(auVar1,0xf493,7);
    auVar1 = vpinsrw_avx(ZEXT216(0xfa7e),0xfa7e,1);
    auVar1 = vpinsrw_avx(auVar1,0xfa7e,2);
    auVar1 = vpinsrw_avx(auVar1,0xfa7e,3);
    auVar1 = vpinsrw_avx(auVar1,0xfa7e,4);
    auVar1 = vpinsrw_avx(auVar1,0xfa7e,5);
    auVar1 = vpinsrw_avx(auVar1,0xfa7e,6);
    auVar4 = vpinsrw_avx(auVar1,0xfa7e,7);
    auVar1 = vpinsrw_avx(ZEXT216(0x1c5a),0x1c5a,1);
    auVar1 = vpinsrw_avx(auVar1,0x1c5a,2);
    auVar1 = vpinsrw_avx(auVar1,0x1c5a,3);
    auVar1 = vpinsrw_avx(auVar1,0x1c5a,4);
    auVar1 = vpinsrw_avx(auVar1,0x1c5a,5);
    auVar1 = vpinsrw_avx(auVar1,0x1c5a,6);
    auVar5 = vpinsrw_avx(auVar1,0x1c5a,7);
    auVar1 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar1 = vpinsrb_avx(auVar1,0x80,2);
    auVar1 = vpinsrb_avx(auVar1,0x80,3);
    auVar1 = vpinsrb_avx(auVar1,0x80,4);
    auVar1 = vpinsrb_avx(auVar1,0x80,5);
    auVar1 = vpinsrb_avx(auVar1,0x80,6);
    auVar1 = vpinsrb_avx(auVar1,0x80,7);
    auVar1 = vpinsrb_avx(auVar1,0x80,8);
    auVar1 = vpinsrb_avx(auVar1,0x80,9);
    auVar1 = vpinsrb_avx(auVar1,0x80,10);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xe);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xf);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    for (; local_504 + 7 < in_R8D; local_504 = local_504 + 8) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(in_RSI + local_504);
      auVar9 = vpunpcklbw_avx(auVar1,auVar9);
      auVar11._8_8_ = o0[0];
      auVar11._0_8_ = *(ulong *)(in_RCX + local_504) ^ o1[1];
      auVar10 = vpunpcklbw_avx(ZEXT816(0),auVar11);
      auVar7._8_8_ = o0[0];
      auVar7._0_8_ = *(ulong *)(in_RDX + local_504) ^ o1[1];
      auVar11 = vpunpcklbw_avx(ZEXT816(0),auVar7);
      auVar8 = vpsrlw_avx(auVar9,ZEXT416(4));
      auVar9 = vpmulhw_avx(auVar2,auVar10);
      auVar7 = vpmulhw_avx(auVar4,auVar11);
      auVar11 = vpmulhw_avx(auVar11,auVar5);
      auVar10 = vpmulhw_avx(auVar10,auVar3);
      auVar9 = vpaddw_avx(auVar9,auVar8);
      auVar7 = vpaddw_avx(auVar7,auVar8);
      auVar11 = vpaddw_avx(auVar8,auVar11);
      auVar7 = vpaddw_avx(auVar7,auVar10);
      auVar9 = vpsraw_avx(auVar9,ZEXT416(4));
      auVar11 = vpsraw_avx(auVar11,ZEXT416(4));
      auVar7 = vpsraw_avx(auVar7,ZEXT416(4));
      auVar9 = vpackuswb_avx(auVar9,auVar11);
      auVar7 = vpackuswb_avx(auVar7,auVar6);
      auVar11 = vpunpcklbw_avx(auVar9,auVar7);
      auVar9 = vpunpckhbw_avx(auVar9,auVar7);
      auVar7 = vpunpcklwd_avx(auVar11,auVar9);
      auVar9 = vpunpckhwd_avx(auVar11,auVar9);
      local_708 = auVar7._0_8_;
      uStack_700 = auVar7._8_8_;
      *local_4e0 = local_708;
      local_4e0[1] = uStack_700;
      local_718 = auVar9._0_8_;
      uStack_710 = auVar9._8_8_;
      local_4e0[2] = local_718;
      local_4e0[3] = uStack_710;
      local_4e0 = local_4e0 + 4;
    }
  }
  for (; local_504 < in_R8D; local_504 = local_504 + 1) {
    iVar12 = (uint)*(byte *)(in_RSI + local_504) * 0x100000 + 0x80000;
    iVar13 = *(byte *)(in_RCX + local_504) - 0x80;
    iVar14 = *(byte *)(in_RDX + local_504) - 0x80;
    local_720 = iVar12 + iVar13 * 0x166f00 >> 0x14;
    local_724 = (int)(iVar12 + iVar13 * -0xb6d00 + (iVar14 * -0x58200 & 0xffff0000U)) >> 0x14;
    local_728 = iVar12 + iVar14 * 0x1c5a00 >> 0x14;
    if (0xff < local_720) {
      if ((int)local_720 < 0) {
        local_720 = 0;
      }
      else {
        local_720 = 0xff;
      }
    }
    if (0xff < local_724) {
      if ((int)local_724 < 0) {
        local_724 = 0;
      }
      else {
        local_724 = 0xff;
      }
    }
    if (0xff < local_728) {
      if ((int)local_728 < 0) {
        local_728 = 0;
      }
      else {
        local_728 = 0xff;
      }
    }
    *(char *)local_4e0 = (char)local_720;
    *(char *)((long)local_4e0 + 1) = (char)local_724;
    *(char *)((long)local_4e0 + 2) = (char)local_728;
    *(undefined1 *)((long)local_4e0 + 3) = 0xff;
    local_4e0 = (undefined8 *)((long)local_4e0 + (long)in_R9D);
  }
  return;
}

Assistant:

static void stbi__YCbCr_to_RGB_simd(stbi_uc *out, stbi_uc const *y, stbi_uc const *pcb, stbi_uc const *pcr, int count, int step)
{
   int i = 0;

#ifdef STBI_SSE2
   // step == 3 is pretty ugly on the final interleave, and i'm not convinced
   // it's useful in practice (you wouldn't use it for textures, for example).
   // so just accelerate step == 4 case.
   if (step == 4) {
      // this is a fairly straightforward implementation and not super-optimized.
      __m128i signflip  = _mm_set1_epi8(-0x80);
      __m128i cr_const0 = _mm_set1_epi16(   (short) ( 1.40200f*4096.0f+0.5f));
      __m128i cr_const1 = _mm_set1_epi16( - (short) ( 0.71414f*4096.0f+0.5f));
      __m128i cb_const0 = _mm_set1_epi16( - (short) ( 0.34414f*4096.0f+0.5f));
      __m128i cb_const1 = _mm_set1_epi16(   (short) ( 1.77200f*4096.0f+0.5f));
      __m128i y_bias = _mm_set1_epi8((char) (unsigned char) 128);
      __m128i xw = _mm_set1_epi16(255); // alpha channel

      for (; i+7 < count; i += 8) {
         // load
         __m128i y_bytes = _mm_loadl_epi64((__m128i *) (y+i));
         __m128i cr_bytes = _mm_loadl_epi64((__m128i *) (pcr+i));
         __m128i cb_bytes = _mm_loadl_epi64((__m128i *) (pcb+i));
         __m128i cr_biased = _mm_xor_si128(cr_bytes, signflip); // -128
         __m128i cb_biased = _mm_xor_si128(cb_bytes, signflip); // -128

         // unpack to short (and left-shift cr, cb by 8)
         __m128i yw  = _mm_unpacklo_epi8(y_bias, y_bytes);
         __m128i crw = _mm_unpacklo_epi8(_mm_setzero_si128(), cr_biased);
         __m128i cbw = _mm_unpacklo_epi8(_mm_setzero_si128(), cb_biased);

         // color transform
         __m128i yws = _mm_srli_epi16(yw, 4);
         __m128i cr0 = _mm_mulhi_epi16(cr_const0, crw);
         __m128i cb0 = _mm_mulhi_epi16(cb_const0, cbw);
         __m128i cb1 = _mm_mulhi_epi16(cbw, cb_const1);
         __m128i cr1 = _mm_mulhi_epi16(crw, cr_const1);
         __m128i rws = _mm_add_epi16(cr0, yws);
         __m128i gwt = _mm_add_epi16(cb0, yws);
         __m128i bws = _mm_add_epi16(yws, cb1);
         __m128i gws = _mm_add_epi16(gwt, cr1);

         // descale
         __m128i rw = _mm_srai_epi16(rws, 4);
         __m128i bw = _mm_srai_epi16(bws, 4);
         __m128i gw = _mm_srai_epi16(gws, 4);

         // back to byte, set up for transpose
         __m128i brb = _mm_packus_epi16(rw, bw);
         __m128i gxb = _mm_packus_epi16(gw, xw);

         // transpose to interleave channels
         __m128i t0 = _mm_unpacklo_epi8(brb, gxb);
         __m128i t1 = _mm_unpackhi_epi8(brb, gxb);
         __m128i o0 = _mm_unpacklo_epi16(t0, t1);
         __m128i o1 = _mm_unpackhi_epi16(t0, t1);

         // store
         _mm_storeu_si128((__m128i *) (out + 0), o0);
         _mm_storeu_si128((__m128i *) (out + 16), o1);
         out += 32;
      }
   }
#endif

#ifdef STBI_NEON
   // in this version, step=3 support would be easy to add. but is there demand?
   if (step == 4) {
      // this is a fairly straightforward implementation and not super-optimized.
      uint8x8_t signflip = vdup_n_u8(0x80);
      int16x8_t cr_const0 = vdupq_n_s16(   (short) ( 1.40200f*4096.0f+0.5f));
      int16x8_t cr_const1 = vdupq_n_s16( - (short) ( 0.71414f*4096.0f+0.5f));
      int16x8_t cb_const0 = vdupq_n_s16( - (short) ( 0.34414f*4096.0f+0.5f));
      int16x8_t cb_const1 = vdupq_n_s16(   (short) ( 1.77200f*4096.0f+0.5f));

      for (; i+7 < count; i += 8) {
         // load
         uint8x8_t y_bytes  = vld1_u8(y + i);
         uint8x8_t cr_bytes = vld1_u8(pcr + i);
         uint8x8_t cb_bytes = vld1_u8(pcb + i);
         int8x8_t cr_biased = vreinterpret_s8_u8(vsub_u8(cr_bytes, signflip));
         int8x8_t cb_biased = vreinterpret_s8_u8(vsub_u8(cb_bytes, signflip));

         // expand to s16
         int16x8_t yws = vreinterpretq_s16_u16(vshll_n_u8(y_bytes, 4));
         int16x8_t crw = vshll_n_s8(cr_biased, 7);
         int16x8_t cbw = vshll_n_s8(cb_biased, 7);

         // color transform
         int16x8_t cr0 = vqdmulhq_s16(crw, cr_const0);
         int16x8_t cb0 = vqdmulhq_s16(cbw, cb_const0);
         int16x8_t cr1 = vqdmulhq_s16(crw, cr_const1);
         int16x8_t cb1 = vqdmulhq_s16(cbw, cb_const1);
         int16x8_t rws = vaddq_s16(yws, cr0);
         int16x8_t gws = vaddq_s16(vaddq_s16(yws, cb0), cr1);
         int16x8_t bws = vaddq_s16(yws, cb1);

         // undo scaling, round, convert to byte
         uint8x8x4_t o;
         o.val[0] = vqrshrun_n_s16(rws, 4);
         o.val[1] = vqrshrun_n_s16(gws, 4);
         o.val[2] = vqrshrun_n_s16(bws, 4);
         o.val[3] = vdup_n_u8(255);

         // store, interleaving r/g/b/a
         vst4_u8(out, o);
         out += 8*4;
      }
   }
#endif

   for (; i < count; ++i) {
      int y_fixed = (y[i] << 20) + (1<<19); // rounding
      int r,g,b;
      int cr = pcr[i] - 128;
      int cb = pcb[i] - 128;
      r = y_fixed + cr* stbi__float2fixed(1.40200f);
      g = y_fixed + cr*-stbi__float2fixed(0.71414f) + ((cb*-stbi__float2fixed(0.34414f)) & 0xffff0000);
      b = y_fixed                                   +   cb* stbi__float2fixed(1.77200f);
      r >>= 20;
      g >>= 20;
      b >>= 20;
      if ((unsigned) r > 255) { if (r < 0) r = 0; else r = 255; }
      if ((unsigned) g > 255) { if (g < 0) g = 0; else g = 255; }
      if ((unsigned) b > 255) { if (b < 0) b = 0; else b = 255; }
      out[0] = (stbi_uc)r;
      out[1] = (stbi_uc)g;
      out[2] = (stbi_uc)b;
      out[3] = 255;
      out += step;
   }
}